

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O0

void __thiscall script_p2sh_tests::switchover::~switchover(switchover *this)

{
  long lVar1;
  long in_FS_OFFSET;
  BasicTestingSetup *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::~BasicTestingSetup(in_stack_00000020);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(switchover)
{
    // Test switch over code
    CScript notValid;
    ScriptError err;
    notValid << OP_11 << OP_12 << OP_EQUALVERIFY;
    CScript scriptSig;
    scriptSig << Serialize(notValid);

    CScript fund = GetScriptForDestination(ScriptHash(notValid));


    // Validation should succeed under old rules (hash is correct):
    BOOST_CHECK(Verify(scriptSig, fund, false, err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    // Fail under new:
    BOOST_CHECK(!Verify(scriptSig, fund, true, err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EQUALVERIFY, ScriptErrorString(err));
}